

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

void __thiscall
PlanningUnitMADPDiscrete::GetJointObservationHistoryArrays
          (PlanningUnitMADPDiscrete *this,Index johI,Index t,Index *joIs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Index IVar3;
  int iVar4;
  const_reference pvVar5;
  size_t sVar6;
  ulong uVar7;
  long in_RCX;
  uint in_EDX;
  int in_ESI;
  size_type in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 in_ZMM1 [64];
  Index joI_t2;
  size_t b;
  size_t stage;
  Index t2;
  size_t nrJO;
  size_t vec_size;
  Index remainder;
  Index johIwithinThisT;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 local_34;
  undefined4 local_20;
  
  pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                      CONCAT44(in_stack_ffffffffffffffb4,in_ESI),in_RDI);
  IVar3 = Globals::CastLIndexToIndex(*pvVar5);
  local_20 = in_ESI - IVar3;
  sVar6 = GetNrJointObservations((PlanningUnitMADPDiscrete *)0x9d6197);
  for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
    auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,sVar6);
    auVar2 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,(ulong)(~local_34 + in_EDX));
    in_ZMM1 = ZEXT1664(auVar2);
    in_ZMM0._0_8_ = pow(auVar1._0_8_,auVar2._0_8_);
    in_ZMM0._8_56_ = extraout_var;
    uVar7 = vcvttsd2usi_avx512f(in_ZMM0._0_16_);
    iVar4 = (int)(local_20 / uVar7);
    *(int *)(in_RCX + (ulong)local_34 * 4) = iVar4;
    local_20 = local_20 - iVar4 * (int)uVar7;
  }
  return;
}

Assistant:

void 
PlanningUnitMADPDiscrete::GetJointObservationHistoryArrays
    (Index johI, Index t,  Index joIs[]) const
{
    //substract the offset to find out what is the index within the time-step-t-
    //observation-histories.
    Index johIwithinThisT = johI - CastLIndexToIndex(_m_firstJOHIforT.at(t));
   
    Index remainder = johIwithinThisT;
    size_t vec_size = t; // the number of joint observations we are searching
    size_t nrJO = GetNrJointObservations();
    //size_t nrJA = GetNrJointActions();
    for(Index t2=0; t2 < vec_size ; t2++)
    {
        // for explanation see GetJointActionObservationHistoryArrays()
        //
        // we start with stage
        size_t stage = (t-1) - t2;
        //we are going to calculate the joa that took place at time stage
        size_t b = (size_t) pow((double)nrJO, (double)(stage));
        Index joI_t2 = remainder / b;
        joIs[t2] = joI_t2; 
        remainder -= joI_t2 * b;
    }
}